

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O3

CURLcode Curl_dynhds_h1_dprint(dynhds *dynhds,dynbuf *dbuf)

{
  dynhds_entry *pdVar1;
  CURLcode CVar2;
  ulong uVar3;
  
  if (dynhds->hds_len == 0) {
    return CURLE_OK;
  }
  uVar3 = 0;
  do {
    pdVar1 = dynhds->hds[uVar3];
    CVar2 = Curl_dyn_addf(dbuf,"%.*s: %.*s\r\n",(ulong)(uint)pdVar1->namelen,pdVar1->name,
                          (ulong)(uint)pdVar1->valuelen,pdVar1->value);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 < dynhds->hds_len);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_dynhds_h1_dprint(struct dynhds *dynhds, struct dynbuf *dbuf)
{
  CURLcode result = CURLE_OK;
  size_t i;

  if(!dynhds->hds_len)
    return result;

  for(i = 0; i < dynhds->hds_len; ++i) {
    result = Curl_dyn_addf(dbuf, "%.*s: %.*s\r\n",
               (int)dynhds->hds[i]->namelen, dynhds->hds[i]->name,
               (int)dynhds->hds[i]->valuelen, dynhds->hds[i]->value);
    if(result)
      break;
  }

  return result;
}